

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# single_particleSpectra.cpp
# Opt level: O3

void __thiscall
singleParticleSpectra::calculate_two_particle_correlation_charge_dep
          (singleParticleSpectra *this,vector<double,_std::allocator<double>_> *event_Qn_p_real,
          vector<double,_std::allocator<double>_> *event_Qn_p_imag,
          vector<double,_std::allocator<double>_> *event_Qn_m_real,
          vector<double,_std::allocator<double>_> *event_Qn_m_imag,
          vector<double,_std::allocator<double>_> *corr_ss,
          vector<double,_std::allocator<double>_> *corr_ss_err,
          vector<double,_std::allocator<double>_> *corr_os,
          vector<double,_std::allocator<double>_> *corr_os_err)

{
  int iVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  pointer pdVar5;
  long lVar6;
  int i;
  long lVar7;
  size_type __n;
  size_type sVar8;
  double dVar9;
  allocator_type local_111;
  vector<double,_std::allocator<double>_> *local_110;
  vector<double,_std::allocator<double>_> *local_108;
  vector<double,_std::allocator<double>_> temp_Cn2_os_2;
  vector<double,_std::allocator<double>_> temp_Cn2_os_1;
  value_type_conflict local_c8;
  vector<double,_std::allocator<double>_> temp_Cn2_os_1_err;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_2;
  vector<double,_std::allocator<double>_> temp_Cn2_os_2_err;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_2_err;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_1_err;
  vector<double,_std::allocator<double>_> temp_Cn2_ss_1;
  
  temp_Cn2_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_110 = event_Qn_p_real;
  local_108 = event_Qn_p_imag;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_ss_1,(long)this->order_max,(value_type_conflict *)&temp_Cn2_ss_2,
             (allocator_type *)&temp_Cn2_ss_1_err);
  temp_Cn2_ss_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_ss_2,(long)this->order_max,(value_type_conflict *)&temp_Cn2_ss_1_err,
             (allocator_type *)&temp_Cn2_ss_2_err);
  temp_Cn2_ss_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_ss_1_err,(long)this->order_max,(value_type_conflict *)&temp_Cn2_ss_2_err,
             (allocator_type *)&temp_Cn2_os_1);
  temp_Cn2_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_ss_2_err,(long)this->order_max,(value_type_conflict *)&temp_Cn2_os_1,
             (allocator_type *)&temp_Cn2_os_2);
  calculate_two_particle_correlation_charge_base
            (this,local_110,local_108,local_110,local_108,0,&temp_Cn2_ss_1,&temp_Cn2_ss_1_err);
  calculate_two_particle_correlation_charge_base
            (this,event_Qn_m_real,event_Qn_m_imag,event_Qn_m_real,event_Qn_m_imag,0,&temp_Cn2_ss_2,
             &temp_Cn2_ss_2_err);
  __n = (size_type)this->order_max;
  if (0 < (long)__n) {
    pdVar2 = (corr_ss->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (corr_ss_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    sVar8 = 0;
    do {
      dVar9 = temp_Cn2_ss_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8] +
              temp_Cn2_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[sVar8];
      pdVar2[sVar8] = pdVar2[sVar8] + dVar9;
      pdVar3[sVar8] = dVar9 * dVar9 + pdVar3[sVar8];
      sVar8 = sVar8 + 1;
    } while (__n != sVar8);
  }
  temp_Cn2_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_os_1,__n,(value_type_conflict *)&temp_Cn2_os_2,
             (allocator_type *)&temp_Cn2_os_1_err);
  temp_Cn2_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_os_2,(long)this->order_max,(value_type_conflict *)&temp_Cn2_os_1_err,
             (allocator_type *)&temp_Cn2_os_2_err);
  temp_Cn2_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_os_1_err,(long)this->order_max,(value_type_conflict *)&temp_Cn2_os_2_err,
             (allocator_type *)&local_c8);
  local_c8 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            (&temp_Cn2_os_2_err,(long)this->order_max,&local_c8,&local_111);
  iVar1 = this->order_max;
  lVar6 = (long)iVar1;
  if (0 < lVar6) {
    pdVar2 = (local_110->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar3 = (event_Qn_m_real->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar4 = (local_108->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (event_Qn_m_imag->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start;
    lVar7 = 0;
    do {
      dVar9 = pdVar2[lVar7] * pdVar3[lVar7] + pdVar4[lVar7] * pdVar5[lVar7];
      temp_Cn2_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] =
           temp_Cn2_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7] + dVar9;
      temp_Cn2_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] =
           dVar9 * dVar9 +
           temp_Cn2_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
    lVar7 = 0;
    do {
      dVar9 = pdVar3[lVar7] * pdVar2[lVar7] + pdVar5[lVar7] * pdVar4[lVar7];
      temp_Cn2_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] =
           temp_Cn2_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7] + dVar9;
      temp_Cn2_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start[lVar7] =
           dVar9 * dVar9 +
           temp_Cn2_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start[lVar7];
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
    if (0 < iVar1) {
      pdVar2 = (corr_os->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pdVar3 = (corr_os_err->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar7 = 0;
      do {
        dVar9 = temp_Cn2_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7] +
                temp_Cn2_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7];
        pdVar2[lVar7] = pdVar2[lVar7] + dVar9;
        pdVar3[lVar7] = dVar9 * dVar9 + pdVar3[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar6 != lVar7);
    }
  }
  if (temp_Cn2_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_os_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_os_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_os_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_os_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_ss_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_ss_2_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_ss_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_ss_1_err.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_ss_2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (temp_Cn2_ss_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(temp_Cn2_ss_1.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void singleParticleSpectra::calculate_two_particle_correlation_charge_dep(
    vector<double> &event_Qn_p_real, vector<double> &event_Qn_p_imag,
    vector<double> &event_Qn_m_real, vector<double> &event_Qn_m_imag,
    vector<double> &corr_ss, vector<double> &corr_ss_err,
    vector<double> &corr_os, vector<double> &corr_os_err) {
    vector<double> temp_Cn2_ss_1(order_max, 0.);
    vector<double> temp_Cn2_ss_2(order_max, 0.);
    vector<double> temp_Cn2_ss_1_err(order_max, 0.);
    vector<double> temp_Cn2_ss_2_err(order_max, 0.);
    calculate_two_particle_correlation_charge_base(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_p_real, event_Qn_p_imag, 0,
        temp_Cn2_ss_1, temp_Cn2_ss_1_err);
    calculate_two_particle_correlation_charge_base(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_m_real, event_Qn_m_imag, 0,
        temp_Cn2_ss_2, temp_Cn2_ss_2_err);
    for (int i = 0; i < order_max; i++) {
        double local_Cn2_ss = temp_Cn2_ss_1[i] + temp_Cn2_ss_2[i];
        corr_ss[i] += local_Cn2_ss;
        corr_ss_err[i] += local_Cn2_ss * local_Cn2_ss;
    }

    vector<double> temp_Cn2_os_1(order_max, 0.);
    vector<double> temp_Cn2_os_2(order_max, 0.);
    vector<double> temp_Cn2_os_1_err(order_max, 0.);
    vector<double> temp_Cn2_os_2_err(order_max, 0.);
    calculate_two_particle_correlation_charge_base(
        event_Qn_p_real, event_Qn_p_imag, event_Qn_m_real, event_Qn_m_imag, 1,
        temp_Cn2_os_1, temp_Cn2_os_1_err);
    calculate_two_particle_correlation_charge_base(
        event_Qn_m_real, event_Qn_m_imag, event_Qn_p_real, event_Qn_p_imag, 1,
        temp_Cn2_os_2, temp_Cn2_os_2_err);
    for (int i = 0; i < order_max; i++) {
        double local_Cn2_os = temp_Cn2_os_1[i] + temp_Cn2_os_2[i];
        corr_os[i] += local_Cn2_os;
        corr_os_err[i] += local_Cn2_os * local_Cn2_os;
    }
}